

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O2

void __thiscall UnitTest_semantic19::Run(UnitTest_semantic19 *this)

{
  Terminator *pTVar1;
  Terminator *pTVar2;
  allocator local_61;
  string local_60;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_40;
  allocator local_38 [32];
  
  std::__cxx11::string::string
            ((string *)&local_60,"if i == 1 then local i = 1 elseif j == 1 then local j = 1 end",
             local_38);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)local_38,"i",&local_61);
  std::__cxx11::string::string((string *)&local_60,(string *)local_38);
  pTVar1 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_40,(FindName *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::string((string *)local_38,"j",&local_61);
  std::__cxx11::string::string((string *)&local_60,(string *)local_38);
  pTVar2 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_40,(FindName *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_38);
  if (pTVar1->scoping_ != LexicalScoping_Global) {
    std::__cxx11::string::string
              ((string *)&local_60,"\'i->scoping_ == luna::LexicalScoping_Global\'",local_38);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (pTVar2->scoping_ != LexicalScoping_Global) {
    std::__cxx11::string::string
              ((string *)&local_60,"\'j->scoping_ == luna::LexicalScoping_Global\'",local_38);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (local_40._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_40._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic19)
{
    auto ast = Semantic("if i == 1 then local i = 1 elseif j == 1 then local j = 1 end");
    auto i = ASTFind<luna::Terminator>(ast, FindName("i"));
    auto j = ASTFind<luna::Terminator>(ast, FindName("j"));
    EXPECT_TRUE(i->scoping_ == luna::LexicalScoping_Global);
    EXPECT_TRUE(j->scoping_ == luna::LexicalScoping_Global);
}